

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxequilisc.hpp
# Opt level: O3

void __thiscall
soplex::SPxEquiliSC<double>::scale(SPxEquiliSC<double> *this,SPxLPBase<double> *lp,bool persistent)

{
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  char cVar1;
  DataArray<int> **ppDVar2;
  DataArray<int> **ppDVar3;
  long lVar4;
  char *pcVar5;
  SPxLPBase<double> *vecset;
  SPxOut *pSVar6;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double extraout_XMM0_Qa_07;
  double extraout_XMM0_Qa_08;
  double extraout_XMM0_Qa_09;
  double extraout_XMM0_Qa_10;
  Verbosity old_verbosity;
  Verbosity local_4c;
  Real local_48;
  double local_40;
  double local_38;
  
  pSVar6 = (this->super_SPxScaler<double>).spxout;
  if ((pSVar6 != (SPxOut *)0x0) && (2 < (int)pSVar6->m_verbosity)) {
    local_4c = pSVar6->m_verbosity;
    (*pSVar6->_vptr_SPxOut[2])();
    pSVar6 = (this->super_SPxScaler<double>).spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar6->m_streams[pSVar6->m_verbosity],"Equilibrium scaling LP",0x16);
    pcVar5 = "";
    if (persistent) {
      pcVar5 = " (persistent)";
    }
    lVar4 = 0xd;
    if (!persistent) {
      lVar4 = 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar6->m_streams[pSVar6->m_verbosity],pcVar5,lVar4);
    cVar1 = (char)pSVar6->m_streams[pSVar6->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar6->m_streams[pSVar6->m_verbosity] + -0x18) +
                    cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    pSVar6 = (this->super_SPxScaler<double>).spxout;
    (*pSVar6->_vptr_SPxOut[2])(pSVar6,&local_4c);
  }
  (**(this->super_SPxScaler<double>)._vptr_SPxScaler)(this,lp);
  (*(this->super_SPxScaler<double>)._vptr_SPxScaler[0x33])(this,lp);
  local_38 = extraout_XMM0_Qa;
  (*(this->super_SPxScaler<double>)._vptr_SPxScaler[0x34])(this,lp);
  this_00 = (this->super_SPxScaler<double>)._tolerances.
            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (this->super_SPxScaler<double>)._tolerances.
            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  local_40 = extraout_XMM0_Qa_00;
  local_48 = Tolerances::epsilon(this_00);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  pSVar6 = (this->super_SPxScaler<double>).spxout;
  if ((pSVar6 != (SPxOut *)0x0) && (3 < (int)pSVar6->m_verbosity)) {
    local_4c = pSVar6->m_verbosity;
    (*pSVar6->_vptr_SPxOut[2])();
    pSVar6 = (this->super_SPxScaler<double>).spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar6->m_streams[pSVar6->m_verbosity],"before scaling:",0xf);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar6->m_streams[pSVar6->m_verbosity]," min= ",6);
    (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[3])(lp,1);
    std::ostream::_M_insert<double>(extraout_XMM0_Qa_01);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar6->m_streams[pSVar6->m_verbosity]," max= ",6);
    (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[4])(lp,1);
    std::ostream::_M_insert<double>(extraout_XMM0_Qa_02);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar6->m_streams[pSVar6->m_verbosity]," col-ratio= ",0xc);
    std::ostream::_M_insert<double>(local_38);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar6->m_streams[pSVar6->m_verbosity]," row-ratio= ",0xc);
    std::ostream::_M_insert<double>(local_40);
    cVar1 = (char)pSVar6->m_streams[pSVar6->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar6->m_streams[pSVar6->m_verbosity] + -0x18) +
                    cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    pSVar6 = (this->super_SPxScaler<double>).spxout;
    (*pSVar6->_vptr_SPxOut[2])(pSVar6,&local_4c);
  }
  if (local_40 <= local_38) {
    computeEquiExpVec((SVSetBase<double> *)lp,(this->super_SPxScaler<double>).m_activeColscaleExp,
                      (this->super_SPxScaler<double>).m_activeRowscaleExp,local_48);
    if ((this->super_SPxScaler<double>).m_doBoth != true) goto LAB_00226e05;
    ppDVar2 = &(this->super_SPxScaler<double>).m_activeColscaleExp;
    ppDVar3 = &(this->super_SPxScaler<double>).m_activeRowscaleExp;
    vecset = (SPxLPBase<double> *)&lp->super_LPColSetBase<double>;
  }
  else {
    computeEquiExpVec(&(lp->super_LPColSetBase<double>).super_SVSetBase<double>,
                      (this->super_SPxScaler<double>).m_activeRowscaleExp,
                      (this->super_SPxScaler<double>).m_activeColscaleExp,local_48);
    if ((this->super_SPxScaler<double>).m_doBoth == false) goto LAB_00226e05;
    ppDVar2 = &(this->super_SPxScaler<double>).m_activeRowscaleExp;
    ppDVar3 = &(this->super_SPxScaler<double>).m_activeColscaleExp;
    vecset = lp;
  }
  computeEquiExpVec((SVSetBase<double> *)vecset,*ppDVar3,*ppDVar2,local_48);
LAB_00226e05:
  (*(this->super_SPxScaler<double>)._vptr_SPxScaler[2])(this,lp);
  pSVar6 = (this->super_SPxScaler<double>).spxout;
  if (pSVar6 != (SPxOut *)0x0) {
    local_4c = pSVar6->m_verbosity;
    if (4 < (int)local_4c) {
      (*pSVar6->_vptr_SPxOut[2])();
      pSVar6 = (this->super_SPxScaler<double>).spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar6->m_streams[pSVar6->m_verbosity],"Row scaling min= ",0x11);
      (*(this->super_SPxScaler<double>)._vptr_SPxScaler[0x31])(this);
      std::ostream::_M_insert<double>(extraout_XMM0_Qa_03);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar6->m_streams[pSVar6->m_verbosity]," max= ",6);
      (*(this->super_SPxScaler<double>)._vptr_SPxScaler[0x32])(this);
      std::ostream::_M_insert<double>(extraout_XMM0_Qa_04);
      cVar1 = (char)pSVar6->m_streams[pSVar6->m_verbosity];
      std::ios::widen((char)*(undefined8 *)(*(long *)pSVar6->m_streams[pSVar6->m_verbosity] + -0x18)
                      + cVar1);
      std::ostream::put(cVar1);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar6->m_streams[pSVar6->m_verbosity],"Col scaling min= ",0x11);
      (*(this->super_SPxScaler<double>)._vptr_SPxScaler[0x2f])(this);
      std::ostream::_M_insert<double>(extraout_XMM0_Qa_05);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar6->m_streams[pSVar6->m_verbosity]," max= ",6);
      (*(this->super_SPxScaler<double>)._vptr_SPxScaler[0x30])(this);
      std::ostream::_M_insert<double>(extraout_XMM0_Qa_06);
      cVar1 = (char)pSVar6->m_streams[pSVar6->m_verbosity];
      std::ios::widen((char)*(undefined8 *)(*(long *)pSVar6->m_streams[pSVar6->m_verbosity] + -0x18)
                      + cVar1);
      std::ostream::put(cVar1);
      std::ostream::flush();
      pSVar6 = (this->super_SPxScaler<double>).spxout;
      (*pSVar6->_vptr_SPxOut[2])(pSVar6,&local_4c);
      pSVar6 = (this->super_SPxScaler<double>).spxout;
      if (pSVar6 == (SPxOut *)0x0) {
        return;
      }
    }
    local_4c = pSVar6->m_verbosity;
    if (3 < (int)local_4c) {
      (*pSVar6->_vptr_SPxOut[2])();
      pSVar6 = (this->super_SPxScaler<double>).spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar6->m_streams[pSVar6->m_verbosity],"after scaling: ",0xf);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar6->m_streams[pSVar6->m_verbosity]," min= ",6);
      (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[3])(lp,0);
      std::ostream::_M_insert<double>(extraout_XMM0_Qa_07);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar6->m_streams[pSVar6->m_verbosity]," max= ",6);
      (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[4])(lp,0);
      std::ostream::_M_insert<double>(extraout_XMM0_Qa_08);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar6->m_streams[pSVar6->m_verbosity]," col-ratio= ",0xc);
      (*(this->super_SPxScaler<double>)._vptr_SPxScaler[0x33])(this,lp);
      std::ostream::_M_insert<double>(extraout_XMM0_Qa_09);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar6->m_streams[pSVar6->m_verbosity]," row-ratio= ",0xc);
      (*(this->super_SPxScaler<double>)._vptr_SPxScaler[0x34])(this,lp);
      std::ostream::_M_insert<double>(extraout_XMM0_Qa_10);
      cVar1 = (char)pSVar6->m_streams[pSVar6->m_verbosity];
      std::ios::widen((char)*(undefined8 *)(*(long *)pSVar6->m_streams[pSVar6->m_verbosity] + -0x18)
                      + cVar1);
      std::ostream::put(cVar1);
      std::ostream::flush();
      pSVar6 = (this->super_SPxScaler<double>).spxout;
      (*pSVar6->_vptr_SPxOut[2])(pSVar6,&local_4c);
    }
  }
  return;
}

Assistant:

void SPxEquiliSC<R>::scale(SPxLPBase<R>& lp, bool persistent)
{

   SPX_MSG_INFO1((*this->spxout), (*this->spxout) << "Equilibrium scaling LP" <<
                 (persistent ? " (persistent)" : "") << std::endl;)

   this->setup(lp);

   /* We want to do the direction first, which has a lower maximal ratio,
    * since the lowest value in the scaled matrix is bounded from below by
    * the inverse of the maximum ratio of the direction that is done first
    * Example:
    *
    *                     Rowratio
    *            0.1  1   10
    *            10   1   10
    *
    * Colratio   100  1
    *
    * Row first =>         Col next =>
    *            0.1  1          0.1  1
    *            1    0.1        1    0.1
    *
    * Col first =>         Row next =>
    *            0.01 1          0.01 1
    *            1    1          1    1
    *
    */
   R colratio = this->maxColRatio(lp);
   R rowratio = this->maxRowRatio(lp);
   R epsilon = this->tolerances()->epsilon();

   bool colFirst = colratio < rowratio;

   SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "before scaling:"
                 << " min= " << lp.minAbsNzo()
                 << " max= " << lp.maxAbsNzo()
                 << " col-ratio= " << colratio
                 << " row-ratio= " << rowratio
                 << std::endl;)

   if(colFirst)
   {
      computeEquiExpVec(lp.colSet(), *this->m_activeRowscaleExp, *this->m_activeColscaleExp, epsilon);

      if(this->m_doBoth)
         computeEquiExpVec(lp.rowSet(), *this->m_activeColscaleExp, *this->m_activeRowscaleExp, epsilon);
   }
   else
   {
      computeEquiExpVec(lp.rowSet(), *this->m_activeColscaleExp, *this->m_activeRowscaleExp, epsilon);

      if(this->m_doBoth)
         computeEquiExpVec(lp.colSet(), *this->m_activeRowscaleExp, *this->m_activeColscaleExp, epsilon);
   }

   /* scale */
   this->applyScaling(lp);

   SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "Row scaling min= " << this->minAbsRowscale()
                 << " max= " << this->maxAbsRowscale()
                 << std::endl
                 << "Col scaling min= " << this->minAbsColscale()
                 << " max= " << this->maxAbsColscale()
                 << std::endl;)

   SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "after scaling: "
                 << " min= " << lp.minAbsNzo(false)
                 << " max= " << lp.maxAbsNzo(false)
                 << " col-ratio= " << this->maxColRatio(lp)
                 << " row-ratio= " << this->maxRowRatio(lp)
                 << std::endl;)

}